

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O0

void __thiscall wasm::ReorderFunctionsByName::run(ReorderFunctionsByName *this,Module *module)

{
  iterator iVar1;
  iterator iVar2;
  Module *module_local;
  ReorderFunctionsByName *this_local;
  
  iVar1 = std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::begin(&module->functions);
  iVar2 = std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::end(&module->functions);
  std::
  sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>*,std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>,wasm::ReorderFunctionsByName::run(wasm::Module*)::_lambda(std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&,std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&)_1_>
            (iVar1._M_current,iVar2._M_current);
  return;
}

Assistant:

void run(Module* module) override {
    std::sort(module->functions.begin(),
              module->functions.end(),
              [](const std::unique_ptr<Function>& a,
                 const std::unique_ptr<Function>& b) -> bool {
                return a->name < b->name;
              });
  }